

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_floor(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0xd)) {
    local_8 = sexp_ratio_floor(in_RDX,in_RCX);
  }
  else if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0xb)) {
    floor((in_RCX->value).flonum);
    local_8 = sexp_make_flonum(in_RCX,(double)in_RDI);
  }
  else {
    local_8 = in_RCX;
    if ((((ulong)in_RCX & 1) != 1) && ((((ulong)in_RCX & 3) != 0 || (in_RCX->tag != 0xc)))) {
      local_8 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
    }
  }
  return local_8;
}

Assistant:

sexp sexp_log (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  double d;
#if SEXP_USE_COMPLEX
  sexp_gc_var1(tmp);
  if (sexp_complexp(z))
    return sexp_complex_log(ctx, z);
#endif
  if (sexp_flonump(z))
    d = sexp_flonum_value(z);
  else if (sexp_fixnump(z))
    d = (double)sexp_unbox_fixnum(z);
  maybe_convert_ratio(ctx, z)
  maybe_convert_bignum(z)
  else
    return sexp_type_exception(ctx, self, SEXP_NUMBER, z);
#if SEXP_USE_COMPLEX
  if (d < 0) {
    sexp_gc_preserve1(ctx, tmp);
    tmp = sexp_make_flonum(ctx, d);
    tmp = sexp_make_complex(ctx, tmp, SEXP_ZERO);
    tmp = sexp_complex_log(ctx, tmp);
    sexp_gc_release1(ctx);
    return tmp;
  }
#endif
  return sexp_make_flonum(ctx, log(d));
}